

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.hpp
# Opt level: O2

Vector<double,_7U> * __thiscall
OpenMD::RNEMD::SPFForceManager::linearCombination<OpenMD::Vector<double,7u>>
          (Vector<double,_7U> *__return_storage_ptr__,SPFForceManager *this,
          Vector<double,_7U> *quantityA,Vector<double,_7U> *quantityB)

{
  double dVar1;
  double dVar2;
  undefined1 local_98 [112];
  
  Snapshot::getSPFData((Snapshot *)local_98);
  dVar1 = pow((((pointer)(local_98._0_8_ + 0x18))->super_Vector<double,_3U>).data_[0],
              (double)this->k_);
  dVar2 = 1.0;
  if (dVar1 <= 1.0) {
    dVar2 = dVar1;
  }
  dVar2 = (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  operator*((Vector<double,_7U> *)local_98,1.0 - dVar2,quantityA);
  operator*((Vector<double,_7U> *)(local_98 + 0x38),dVar2,quantityB);
  OpenMD::operator+(__return_storage_ptr__,(Vector<double,_7U> *)local_98,
                    (Vector<double,_7U> *)(local_98 + 0x38));
  return __return_storage_ptr__;
}

Assistant:

T linearCombination(T quantityA, T quantityB) {
      RealType result = f_lambda(currentSnapshot_->getSPFData()->lambda);

      return T {(1.0 - result) * quantityA + result * quantityB};
    }